

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_modinv64_uint16(uint16_t *out,uint16_t *in,uint16_t *mod)

{
  int64_t *piVar1;
  long lVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint64_t uVar15;
  byte bVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  secp256k1_modinv64_modinfo *modinfo;
  ulong uVar20;
  secp256k1_modinv64_signed62 *psVar21;
  secp256k1_modinv64_signed62 *psVar22;
  uint16_t *out_00;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  char cVar26;
  long lVar27;
  int iVar28;
  code *pcVar29;
  int64_t iVar30;
  int iVar31;
  bool bVar32;
  secp256k1_modinv64_signed62 x;
  secp256k1_modinv64_modinfo m;
  uint16_t tmp [16];
  uint16_t negone [16];
  int iStack_194;
  secp256k1_modinv32_trans2x2 sStack_190;
  undefined8 uStack_180;
  secp256k1_modinv32_signed30 sStack_178;
  int iStack_14c;
  secp256k1_modinv32_signed30 sStack_148;
  uint16_t *puStack_120;
  ulong uStack_118;
  code *pcStack_110;
  uint16_t *puStack_108;
  uint16_t *puStack_100;
  code *pcStack_f8;
  code *pcStack_f0;
  secp256k1_modinv64_signed62 local_e8;
  ulong local_c0;
  secp256k1_modinv64_modinfo local_b8;
  ushort local_88 [20];
  uint16_t *local_60;
  uint16_t local_58;
  undefined8 local_56;
  undefined6 uStack_4e;
  undefined2 uStack_48;
  undefined6 uStack_46;
  undefined8 uStack_40;
  
  psVar21 = &local_e8;
  psVar22 = &local_e8;
  local_e8.v[0] = 0;
  local_e8.v[1] = 0;
  local_e8.v[2] = 0;
  local_e8.v[3] = 0;
  local_e8.v[4] = 0;
  uVar19 = 0;
  do {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar19 >> 1;
    local_e8.v[((byte)((uVar19 & 0xffffffff) >> 1) & 0x7f) / 0x1f] =
         local_e8.v[((byte)((uVar19 & 0xffffffff) >> 1) & 0x7f) / 0x1f] |
         (ulong)((in[uVar19 >> 4 & 0xfffffff] >> ((uint)uVar19 & 0xf) & 1) != 0) <<
         ((char)(SUB164(auVar4 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' + (char)uVar19 &
         0x3fU);
    uVar19 = uVar19 + 1;
  } while ((int)uVar19 != 0x100);
  local_c0 = local_e8.v[1] | local_e8.v[0] | local_e8.v[2] | local_e8.v[3] | local_e8.v[4];
  local_b8.modulus.v[0] = 0;
  local_b8.modulus.v[1] = 0;
  local_b8.modulus.v[2] = 0;
  local_b8.modulus.v[3] = 0;
  local_b8.modulus.v[4] = 0;
  modinfo = (secp256k1_modinv64_modinfo *)0x0;
  do {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (ulong)modinfo >> 1;
    piVar1 = local_b8.modulus.v + ((byte)(((ulong)modinfo & 0xffffffff) >> 1) & 0x7f) / 0x1f;
    *piVar1 = *piVar1 | (ulong)((mod[(ulong)modinfo >> 4 & 0xfffffff] >> ((uint)modinfo & 0xf) & 1)
                               != 0) <<
                        ((char)(SUB164(auVar5 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)modinfo & 0x3fU);
    iVar30 = local_b8.modulus.v[0];
    modinfo = (secp256k1_modinv64_modinfo *)((long)(modinfo->modulus).v + 1);
  } while ((int)modinfo != 0x100);
  pcVar29 = (code *)0x3fffffffffffffff;
  pcStack_f0 = (code *)0x16c439;
  out_00 = (uint16_t *)local_b8.modulus.v[0];
  uVar15 = modinv2p64(local_b8.modulus.v[0]);
  local_b8.modulus_inv62 = uVar15 & 0x3fffffffffffffff;
  uVar19 = iVar30 * uVar15 & 0x3fffffffffffffff;
  if (uVar19 != 1) goto LAB_0016c89a;
  if (local_c0 == 0) {
LAB_0016c5b1:
    local_e8.v[2] = 0;
    local_e8.v[3] = 0;
    local_e8.v[0] = 0;
    local_e8.v[1] = 0;
    local_e8.v[4] = 0;
    uVar19 = 0;
    do {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar19 >> 1;
      local_e8.v[((byte)((uVar19 & 0xffffffff) >> 1) & 0x7f) / 0x1f] =
           local_e8.v[((byte)((uVar19 & 0xffffffff) >> 1) & 0x7f) / 0x1f] |
           (ulong)((in[uVar19 >> 4 & 0xfffffff] >> ((uint)uVar19 & 0xf) & 1) != 0) <<
           ((char)(SUB164(auVar8 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' + (char)uVar19 &
           0x3fU);
      uVar19 = uVar19 + 1;
    } while ((int)uVar19 != 0x100);
    local_60 = mod;
    iVar13 = 8;
    do {
      uVar19 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
      uVar20 = uVar19 >> 0x1e;
      uVar19 = uVar19 >> 0x3e;
      lVar27 = local_b8.modulus.v[uVar19];
      if (lVar27 < 1) {
        if (lVar27 < 0) {
          uVar20 = uVar20 + 0x100000000 >> 0x20;
          lVar2 = local_b8.modulus.v[uVar20];
          if (-0x4000000000000000 < lVar2) {
            lVar27 = lVar27 + 0x4000000000000000;
            local_b8.modulus.v[uVar19] = lVar27;
            iVar30 = lVar2 + -1;
            goto LAB_0016c6a5;
          }
        }
      }
      else {
        uVar20 = uVar20 + 0x100000000 >> 0x20;
        lVar2 = local_b8.modulus.v[uVar20];
        if (lVar2 < 0x4000000000000000) {
          lVar27 = lVar27 + -0x4000000000000000;
          local_b8.modulus.v[uVar19] = lVar27;
          iVar30 = lVar2 + 1;
LAB_0016c6a5:
          local_b8.modulus.v[uVar20] = iVar30;
        }
      }
      uVar25 = secp256k1_test_state[1] << 0x11;
      uVar20 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar19 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar20;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar19;
      secp256k1_test_state[2] = uVar20 ^ uVar25;
      secp256k1_test_state[3] = uVar19 << 0x2d | uVar19 >> 0x13;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
    bVar32 = local_c0 != 0;
    mod = (uint16_t *)(ulong)bVar32;
    uVar19 = CONCAT71((int7)((ulong)lVar27 >> 8),1);
    while( true ) {
      cVar26 = (char)uVar19;
      pcVar29 = secp256k1_modinv64_var;
      if (cVar26 != '\0') {
        pcVar29 = secp256k1_modinv64;
      }
      pcStack_f0 = (code *)0x16c757;
      (*pcVar29)(&local_e8);
      out[8] = 0;
      out[9] = 0;
      out[10] = 0;
      out[0xb] = 0;
      out[0xc] = 0;
      out[0xd] = 0;
      out[0xe] = 0;
      out[0xf] = 0;
      out[0] = 0;
      out[1] = 0;
      out[2] = 0;
      out[3] = 0;
      out[4] = 0;
      out[5] = 0;
      out[6] = 0;
      out[7] = 0;
      uVar20 = 0;
      do {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar20 >> 1;
        out[uVar20 >> 4 & 0xfffffff] =
             out[uVar20 >> 4 & 0xfffffff] |
             (ushort)(((ulong)local_e8.v[((byte)((uVar20 & 0xffffffff) >> 1) & 0x7f) / 0x1f] >>
                       ((ulong)((SUB164(auVar9 * ZEXT816(0x8421084210842109),8) >> 4) * 2 +
                               (int)uVar20) & 0x3f) & 1) != 0) << ((byte)uVar20 & 0xf);
        uVar20 = uVar20 + 1;
      } while ((int)uVar20 != 0x100);
      out_00 = local_88;
      pcStack_f0 = (code *)0x16c7c8;
      modinfo = (secp256k1_modinv64_modinfo *)out;
      mulmod256(out_00,out,in,local_60);
      if (local_88[0] != bVar32) break;
      lVar27 = 1;
      do {
        if (local_88[lVar27] != 0) {
          pcStack_f0 = (code *)0x16c890;
          test_modinv64_uint16_cold_4();
          goto LAB_0016c890;
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 != 0x10);
      pcStack_f0 = (code *)0x16c7f8;
      (*pcVar29)(&local_e8);
      local_88[8] = 0;
      local_88[9] = 0;
      local_88[10] = 0;
      local_88[0xb] = 0;
      local_88[0xc] = 0;
      local_88[0xd] = 0;
      local_88[0xe] = 0;
      local_88[0xf] = 0;
      local_88[0] = 0;
      local_88[1] = 0;
      local_88[2] = 0;
      local_88[3] = 0;
      local_88[4] = 0;
      local_88[5] = 0;
      local_88[6] = 0;
      local_88[7] = 0;
      modinfo = (secp256k1_modinv64_modinfo *)0x0;
      do {
        auVar10._8_8_ = 0;
        auVar10._0_8_ = (ulong)modinfo >> 1;
        out_00 = (uint16_t *)
                 ((ulong)(((ulong)local_e8.v
                                  [((byte)(((ulong)modinfo & 0xffffffff) >> 1) & 0x7f) / 0x1f] >>
                           ((ulong)((SUB164(auVar10 * ZEXT816(0x8421084210842109),8) >> 4) * 2 +
                                   (int)modinfo) & 0x3f) & 1) != 0) << ((byte)modinfo & 0xf));
        local_88[(ulong)modinfo >> 4 & 0xfffffff] =
             local_88[(ulong)modinfo >> 4 & 0xfffffff] | (ushort)out_00;
        modinfo = (secp256k1_modinv64_modinfo *)((long)(modinfo->modulus).v + 1);
      } while ((int)modinfo != 0x100);
      lVar27 = 0;
      do {
        if (local_88[lVar27] != in[lVar27]) goto LAB_0016c890;
        lVar27 = lVar27 + 1;
      } while (lVar27 != 0x10);
      uVar19 = 0;
      if (cVar26 == '\0') {
        return;
      }
    }
    goto LAB_0016c895;
  }
  pcStack_f0 = (code *)0x16c473;
  mulmod256(local_88,in,in,mod);
  local_e8.v[2] = 0;
  local_e8.v[3] = 0;
  local_e8.v[0] = 0;
  local_e8.v[1] = 0;
  local_e8.v[4] = 0;
  uVar20 = 0;
  do {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar20 >> 1;
    local_e8.v[((byte)((uVar20 & 0xffffffff) >> 1) & 0x7f) / 0x1f] =
         local_e8.v[((byte)((uVar20 & 0xffffffff) >> 1) & 0x7f) / 0x1f] |
         (ulong)((local_88[uVar20 >> 4 & 0xfffffff] >> ((uint)uVar20 & 0xf) & 1) != 0) <<
         ((char)(SUB164(auVar6 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' + (char)uVar20 &
         0x3fU);
    uVar20 = uVar20 + 1;
  } while ((int)uVar20 != 0x100);
  modinfo = &local_b8;
  pcStack_f0 = (code *)0x16c4e9;
  uVar12 = secp256k1_jacobi64_maybe_var(&local_e8,modinfo);
  if (uVar12 < 2) {
    local_58 = *mod - 1;
    local_56 = *(undefined8 *)(mod + 1);
    uStack_40 = *(undefined8 *)(mod + 0xc);
    uStack_4e = (undefined6)*(undefined8 *)(mod + 5);
    uStack_48 = (undefined2)*(undefined8 *)(mod + 8);
    uStack_46 = (undefined6)((ulong)*(undefined8 *)(mod + 8) >> 0x10);
    pcStack_f0 = (code *)0x16c522;
    mulmod256(local_88,local_88,&local_58,mod);
    local_e8.v[2] = 0;
    local_e8.v[3] = 0;
    local_e8.v[0] = 0;
    local_e8.v[1] = 0;
    local_e8.v[4] = 0;
    uVar20 = 0;
    do {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar20 >> 1;
      local_e8.v[((byte)((uVar20 & 0xffffffff) >> 1) & 0x7f) / 0x1f] =
           local_e8.v[((byte)((uVar20 & 0xffffffff) >> 1) & 0x7f) / 0x1f] |
           (ulong)((local_88[uVar20 >> 4 & 0xfffffff] >> ((uint)uVar20 & 0xf) & 1) != 0) <<
           ((char)(SUB164(auVar7 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' + (char)uVar20 &
           0x3fU);
      uVar20 = uVar20 + 1;
    } while ((int)uVar20 != 0x100);
    modinfo = &local_b8;
    pcStack_f0 = (code *)0x16c598;
    iVar13 = secp256k1_jacobi64_maybe_var(&local_e8,modinfo);
    if ((iVar13 != 0) && (iVar13 != 1 - (*mod & 2))) goto LAB_0016c8a4;
    goto LAB_0016c5b1;
  }
LAB_0016c89f:
  psVar22 = psVar21;
  pcStack_f0 = (code *)0x16c8a4;
  test_modinv64_uint16_cold_6();
LAB_0016c8a4:
  pcStack_f0 = modinv2p64;
  test_modinv64_uint16_cold_2();
  if (((ulong)psVar22 & 1) != 0) {
    iVar13 = 6;
    do {
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
    return;
  }
  pcStack_f8 = secp256k1_jacobi32_maybe_var;
  modinv2p64_cold_1();
  pcStack_f8 = (code *)0x8421084210842109;
  puStack_100 = out;
  puStack_108 = in;
  pcStack_110 = pcVar29;
  uStack_118 = uVar19;
  puStack_120 = mod;
  sStack_178.v[8] = (int32_t)(modinfo->modulus).v[4];
  iVar30 = (modinfo->modulus).v[0];
  sStack_178.v._16_8_ = (modinfo->modulus).v[2];
  sStack_178.v._24_8_ = (modinfo->modulus).v[3];
  sStack_178.v[0] = (int)iVar30;
  sStack_178.v[1] = (int)((ulong)iVar30 >> 0x20);
  uVar11 = sStack_178.v._0_8_;
  sStack_178.v._8_8_ = (modinfo->modulus).v[1];
  sStack_148.v[8] = *(int32_t *)((long)psVar22 + 0x20);
  sStack_148.v._0_8_ = psVar22->v[0];
  sStack_148.v._8_8_ = *(undefined8 *)((long)psVar22 + 8);
  sStack_148.v._16_8_ = *(undefined8 *)((long)psVar22 + 0x10);
  sStack_148.v._24_8_ = *(undefined8 *)((long)psVar22 + 0x18);
  uVar19 = 9;
  iVar28 = -1;
  iVar13 = 0;
  sStack_178.v[0] = (int32_t)iVar30;
  uVar12 = sStack_178.v[0];
  sStack_178.v._0_8_ = uVar11;
  do {
    iVar17 = 0;
    if ((sStack_148.v[0] | 0xc0000000U) != 0) {
      for (; ((sStack_148.v[0] | 0xc0000000U) >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
      }
    }
    iVar28 = iVar28 - iVar17;
    if (iVar17 == 0x1e) {
      sStack_190.u = 0x40000000;
      iStack_194 = 1;
      sStack_190.q = 0;
      sStack_190.v = 0;
    }
    else {
      uVar12 = sStack_178.v[1] << 0x1e | uVar12;
      iStack_194 = 1;
      sStack_190.u = 1 << ((byte)iVar17 & 0x1f);
      uVar18 = (uint)(sStack_148.v[1] << 0x1e | sStack_148.v[0]) >> ((byte)iVar17 & 0x1f);
      iVar17 = 0x1e - iVar17;
      sStack_190.v = 0;
      sStack_190.q = 0;
      do {
        uVar23 = uVar18;
        iVar31 = sStack_190.u;
        iVar24 = sStack_190.v;
        if (iVar28 < 0) {
          iVar28 = -iVar28;
          uVar23 = uVar12;
          iVar31 = sStack_190.q;
          uVar12 = uVar18;
          sStack_190.q = sStack_190.u;
          iVar24 = iStack_194;
          iStack_194 = sStack_190.v;
        }
        iVar3 = iVar28 + 1;
        if (iVar17 <= iVar28 + 1) {
          iVar3 = iVar17;
        }
        uVar14 = ((uint)(byte)(secp256k1_modinv32_inv256[uVar12 >> 1 & 0x7f] * (char)uVar23) <<
                 (-(char)iVar3 & 0x1fU)) >> (-(char)iVar3 & 0x1fU);
        uVar23 = uVar14 * uVar12 + uVar23;
        sStack_190.q = uVar14 * iVar31 + sStack_190.q;
        uVar18 = -1 << ((byte)iVar17 & 0x1f) | uVar23;
        iVar3 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
          }
        }
        bVar16 = (byte)iVar3;
        uVar18 = uVar23 >> (bVar16 & 0x1f);
        sStack_190.u = iVar31 << (bVar16 & 0x1f);
        sStack_190.v = iVar24 << (bVar16 & 0x1f);
        iStack_194 = uVar14 * iVar24 + iStack_194;
        iVar28 = iVar28 - iVar3;
        iVar17 = iVar17 - iVar3;
      } while (iVar17 != 0);
    }
    uVar12 = (uint)uVar19;
    sStack_190.r = iStack_194;
    uStack_180 = uVar19;
    secp256k1_modinv32_update_fg_30_var(uVar12,&sStack_178,&sStack_148,&sStack_190);
    if (sStack_178.v[0] == 1) {
      if ((int)uVar12 < 2) {
        return;
      }
      uVar18 = 0;
      uVar20 = 1;
      do {
        uVar18 = uVar18 | sStack_178.v[uVar20];
        uVar20 = uVar20 + 1;
      } while (uVar19 != uVar20);
      if (uVar18 == 0) {
        return;
      }
    }
    uVar18 = uVar12 - 1;
    if (((int)(uVar12 - 2) < 0 || *(int *)((long)&uStack_180 + (long)(int)uVar12 * 4 + 4) != 0) ||
        (&iStack_14c)[(int)uVar12] != 0) {
      uVar18 = uVar12;
    }
    iVar13 = iVar13 + 1;
    uVar19 = (ulong)uVar18;
    uVar12 = sStack_178.v[0];
    if (iVar13 == 0x32) {
      return;
    }
  } while( true );
LAB_0016c890:
  pcStack_f0 = (code *)0x16c895;
  test_modinv64_uint16_cold_5();
LAB_0016c895:
  pcStack_f0 = (code *)0x16c89a;
  test_modinv64_uint16_cold_3();
LAB_0016c89a:
  pcStack_f0 = (code *)0x16c89f;
  test_modinv64_uint16_cold_1();
  psVar21 = (secp256k1_modinv64_signed62 *)out_00;
  goto LAB_0016c89f;
}

Assistant:

static void test_modinv64_uint16(uint16_t* out, const uint16_t* in, const uint16_t* mod) {
    static const int64_t M62 = (int64_t)(UINT64_MAX >> 2);
    uint16_t tmp[16];
    secp256k1_modinv64_signed62 x;
    secp256k1_modinv64_modinfo m;
    int i, vartime, nonzero;

    uint16_to_signed62(&x, in);
    nonzero = (x.v[0] | x.v[1] | x.v[2] | x.v[3] | x.v[4]) != 0;
    uint16_to_signed62(&m.modulus, mod);

    /* compute 1/modulus mod 2^62 */
    m.modulus_inv62 = modinv2p64(m.modulus.v[0]) & M62;
    CHECK(((m.modulus_inv62 * m.modulus.v[0]) & M62) == 1);

    /* Test secp256k1_jacobi64_maybe_var. */
    if (nonzero) {
        int jac;
        uint16_t sqr[16], negone[16];
        mulmod256(sqr, in, in, mod);
        uint16_to_signed62(&x, sqr);
        /* Compute jacobi symbol of in^2, which must be 1 (or uncomputable). */
        jac = secp256k1_jacobi64_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1);
        /* Then compute the jacobi symbol of -(in^2). x and -x have opposite
         * jacobi symbols if and only if (mod % 4) == 3. */
        negone[0] = mod[0] - 1;
        for (i = 1; i < 16; ++i) negone[i] = mod[i];
        mulmod256(sqr, sqr, negone, mod);
        uint16_to_signed62(&x, sqr);
        jac = secp256k1_jacobi64_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1 - (mod[0] & 2));
    }

    uint16_to_signed62(&x, in);
    mutate_sign_signed62(&m.modulus);
    for (vartime = 0; vartime < 2; ++vartime) {
        /* compute inverse */
        (vartime ? secp256k1_modinv64_var : secp256k1_modinv64)(&x, &m);

        /* produce output */
        signed62_to_uint16(out, &x);

        /* check if the inverse times the input is 1 (mod m), unless x is 0. */
        mulmod256(tmp, out, in, mod);
        CHECK(tmp[0] == nonzero);
        for (i = 1; i < 16; ++i) CHECK(tmp[i] == 0);

        /* invert again */
        (vartime ? secp256k1_modinv64_var : secp256k1_modinv64)(&x, &m);

        /* check if the result is equal to the input */
        signed62_to_uint16(tmp, &x);
        for (i = 0; i < 16; ++i) CHECK(tmp[i] == in[i]);
    }
}